

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_description-c.cpp
# Opt level: O1

char * duckdb_table_description_get_column_name
                 (duckdb_table_description table_description,idx_t index)

{
  duckdb_state dVar1;
  pointer pTVar2;
  reference this;
  char *__dest;
  string name;
  string local_38;
  
  dVar1 = GetTableDescription((TableDescriptionWrapper *)table_description,index);
  if (dVar1 == DuckDBSuccess) {
    pTVar2 = duckdb::
             unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
             ::operator->((unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
                           *)table_description);
    this = duckdb::vector<duckdb::ColumnDefinition,_true>::operator[](&pTVar2->columns,index);
    duckdb::ColumnDefinition::GetName_abi_cxx11_(&local_38,this);
    __dest = (char *)malloc(local_38._M_string_length + 1);
    switchD_012dd528::default(__dest,local_38._M_dataplus._M_p,local_38._M_string_length);
    __dest[local_38._M_string_length] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  else {
    __dest = (char *)0x0;
  }
  return __dest;
}

Assistant:

char *duckdb_table_description_get_column_name(duckdb_table_description table_description, idx_t index) {
	auto wrapper = reinterpret_cast<TableDescriptionWrapper *>(table_description);
	if (GetTableDescription(wrapper, index) == DuckDBError) {
		return nullptr;
	}

	auto &table = wrapper->description;
	auto &column = table->columns[index];

	auto name = column.GetName();
	auto result = reinterpret_cast<char *>(malloc(sizeof(char) * (name.size() + 1)));
	memcpy(result, name.c_str(), name.size());
	result[name.size()] = '\0';

	return result;
}